

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::dump(Builder *this,Vector<unsigned_int> *out)

{
  int iVar1;
  bool bVar2;
  reference pCVar3;
  pointer this_00;
  char *str;
  size_type sVar4;
  const_reference ppcVar5;
  undefined1 local_140 [8];
  Instruction sourceExtInst;
  undefined1 local_100 [4];
  int e;
  Instruction memInst;
  Instruction extInst;
  _Self local_88;
  iterator it_1;
  undefined1 local_70 [8];
  Instruction capInst;
  _Self local_30;
  iterator it;
  value_type_conflict1 local_20;
  value_type_conflict1 local_1c;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *local_18;
  Vector<unsigned_int> *out_local;
  Builder *this_local;
  
  local_18 = out;
  out_local = (Vector<unsigned_int> *)this;
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
            (out,&MagicNumber);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
            (local_18,&Version);
  local_1c = this->builderNumber;
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
            (local_18,&local_1c);
  local_20 = this->uniqueId + 1;
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
            (local_18,&local_20);
  it._M_node._4_4_ = 0;
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
            (local_18,(value_type_conflict1 *)((long)&it._M_node + 4));
  local_30._M_node =
       (_Base_ptr)
       std::
       set<spv::Capability,_std::less<spv::Capability>,_dxil_spv::ThreadLocalAllocator<spv::Capability>_>
       ::cbegin(&this->capabilities);
  while( true ) {
    capInst.block =
         (Block *)std::
                  set<spv::Capability,_std::less<spv::Capability>,_dxil_spv::ThreadLocalAllocator<spv::Capability>_>
                  ::cend(&this->capabilities);
    bVar2 = std::operator!=(&local_30,(_Self *)&capInst.block);
    if (!bVar2) break;
    Instruction::Instruction((Instruction *)local_70,0,0,OpCapability);
    pCVar3 = std::_Rb_tree_const_iterator<spv::Capability>::operator*(&local_30);
    Instruction::addImmediateOperand((Instruction *)local_70,*pCVar3);
    Instruction::dump((Instruction *)local_70,local_18);
    Instruction::~Instruction((Instruction *)local_70);
    std::_Rb_tree_const_iterator<spv::Capability>::operator++(&local_30);
  }
  local_88._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
       ::cbegin(&this->extensions);
  while( true ) {
    extInst.block =
         (Block *)std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
                  ::cend(&this->extensions);
    bVar2 = std::operator!=(&local_88,(_Self *)&extInst.block);
    if (!bVar2) break;
    Instruction::Instruction((Instruction *)&memInst.block,0,0,OpExtension);
    this_00 = std::
              _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>
              ::operator->(&local_88);
    str = std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::c_str
                    (this_00);
    Instruction::addStringOperand((Instruction *)&memInst.block,str);
    Instruction::dump((Instruction *)&memInst.block,local_18);
    Instruction::~Instruction((Instruction *)&memInst.block);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>
    ::operator++(&local_88);
  }
  dumpInstructions(this,local_18,&this->imports);
  Instruction::Instruction((Instruction *)local_100,0,0,OpMemoryModel);
  Instruction::addImmediateOperand((Instruction *)local_100,this->addressModel);
  Instruction::addImmediateOperand((Instruction *)local_100,this->memoryModel);
  Instruction::dump((Instruction *)local_100,local_18);
  dumpInstructions(this,local_18,&this->entryPoints);
  dumpInstructions(this,local_18,&this->executionModes);
  dumpInstructions(this,local_18,&this->strings);
  dumpModuleProcesses(this,local_18);
  dumpSourceInstructions(this,local_18);
  sourceExtInst.block._4_4_ = 0;
  while( true ) {
    iVar1 = sourceExtInst.block._4_4_;
    sVar4 = std::vector<const_char_*,_dxil_spv::ThreadLocalAllocator<const_char_*>_>::size
                      (&this->sourceExtensions);
    if ((int)sVar4 <= iVar1) break;
    Instruction::Instruction((Instruction *)local_140,0,0,OpSourceExtension);
    ppcVar5 = std::vector<const_char_*,_dxil_spv::ThreadLocalAllocator<const_char_*>_>::operator[]
                        (&this->sourceExtensions,(long)sourceExtInst.block._4_4_);
    Instruction::addStringOperand((Instruction *)local_140,*ppcVar5);
    Instruction::dump((Instruction *)local_140,local_18);
    Instruction::~Instruction((Instruction *)local_140);
    sourceExtInst.block._4_4_ = sourceExtInst.block._4_4_ + 1;
  }
  dumpInstructions(this,local_18,&this->names);
  dumpInstructions(this,local_18,&this->lines);
  dumpInstructions(this,local_18,&this->decorations);
  dumpInstructions(this,local_18,&this->constantsTypesGlobals);
  dumpInstructions(this,local_18,&this->externals);
  Module::dump(&this->module,local_18);
  Instruction::~Instruction((Instruction *)local_100);
  return;
}

Assistant:

void Builder::dump(dxil_spv::Vector<unsigned int>& out) const
{
    // Header, before first instructions:
    out.push_back(MagicNumber);
    out.push_back(Version);
    out.push_back(builderNumber);
    out.push_back(uniqueId + 1);
    out.push_back(0);

    // Capabilities
    for (auto it = capabilities.cbegin(); it != capabilities.cend(); ++it) {
        Instruction capInst(0, 0, OpCapability);
        capInst.addImmediateOperand(*it);
        capInst.dump(out);
    }

    for (auto it = extensions.cbegin(); it != extensions.cend(); ++it) {
        Instruction extInst(0, 0, OpExtension);
        extInst.addStringOperand(it->c_str());
        extInst.dump(out);
    }

    dumpInstructions(out, imports);
    Instruction memInst(0, 0, OpMemoryModel);
    memInst.addImmediateOperand(addressModel);
    memInst.addImmediateOperand(memoryModel);
    memInst.dump(out);

    // Instructions saved up while building:
    dumpInstructions(out, entryPoints);
    dumpInstructions(out, executionModes);

    // Debug instructions
    dumpInstructions(out, strings);
    dumpModuleProcesses(out);
    dumpSourceInstructions(out);
    for (int e = 0; e < (int)sourceExtensions.size(); ++e) {
        Instruction sourceExtInst(0, 0, OpSourceExtension);
        sourceExtInst.addStringOperand(sourceExtensions[e]);
        sourceExtInst.dump(out);
    }
    dumpInstructions(out, names);
    dumpInstructions(out, lines);

    // Annotation instructions
    dumpInstructions(out, decorations);

    dumpInstructions(out, constantsTypesGlobals);
    dumpInstructions(out, externals);

    // The functions
    module.dump(out);
}